

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsk.c
# Opt level: O2

LispPTR COM_openfile(LispPTR *args)

{
  char cVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  LispPTR LVar6;
  char *lf_cp;
  LispPTR *pLVar7;
  long lVar8;
  char *host_00;
  size_t sVar9;
  int *piVar10;
  long lVar11;
  DLword *pDVar12;
  ulong uVar13;
  bool bVar14;
  char ver [16];
  stat sbuf;
  char name [255];
  char host [255];
  char file [4096];
  char dir [4096];
  char lfname [4101];
  
  iVar4 = _setjmp((__jmp_buf_tag *)jmpbuf);
  if (iVar4 != 0) {
    *Lisp_errno = 100;
    return 0;
  }
  Lisp_errno = (int *)NativeAligned4FromLAddr(args[5]);
  pLVar7 = NativeAligned4FromLAddr(*args);
  if (*(char *)((long)pLVar7 + 6) == 'D') {
    lVar8 = 5;
    LVar6 = pLVar7[2] * 2;
LAB_00115a6c:
    if (0x1005 < (ulong)((int)LVar6 + lVar8)) {
      *Lisp_errno = 200;
      return 0;
    }
  }
  else {
    if (*(char *)((long)pLVar7 + 6) == 'C') {
      LVar6 = pLVar7[2];
      lVar8 = 3;
      goto LAB_00115a6c;
    }
    error("LispStringLength: Not a character array.\n");
  }
  pLVar7 = NativeAligned4FromLAddr(*args);
  LVar6 = 0x1000;
  if ((int)pLVar7[2] < 0x1000) {
    LVar6 = pLVar7[2];
  }
  lVar8 = (long)(int)LVar6;
  if (*(char *)((long)pLVar7 + 6) == 'D') {
    pDVar12 = Lisp_world + (ulong)(ushort)pLVar7[1] + (ulong)(*pLVar7 & 0xfffffff);
    for (lVar11 = 0; lVar8 != lVar11; lVar11 = lVar11 + 1) {
      lfname[lVar11] = *(char *)((ulong)pDVar12 ^ 2);
      pDVar12 = pDVar12 + 1;
    }
    lfname[lVar11] = '\0';
  }
  else if (*(char *)((long)pLVar7 + 6) == 'C') {
    uVar2 = *pLVar7;
    LVar6 = pLVar7[1];
    for (lVar11 = 0; lVar8 != lVar11; lVar11 = lVar11 + 1) {
      lfname[lVar11] =
           *(char *)((long)Lisp_world +
                     lVar11 + (ulong)(ushort)LVar6 + (ulong)(uVar2 & 0xfffffff) * 2 ^ 3);
    }
    lfname[lVar8] = '\0';
  }
  else {
    error("LispStringToCString: Not a character array.\n");
  }
  host_00 = host;
  separate_host(lfname,host_00);
  for (; cVar1 = *host_00, cVar1 != '\0'; host_00 = host_00 + 1) {
    if ((byte)(cVar1 + 0x9fU) < 0x1a) {
      *host_00 = cVar1 + -0x20;
    }
  }
  bVar14 = host._0_4_ == 0x4b5344;
  if (bVar14) {
    iVar4 = 1;
  }
  else {
    iVar5 = bcmp(host,"UNIX",5);
    iVar4 = 0;
    if (iVar5 != 0) {
      return 0;
    }
  }
  iVar5 = 0;
  unixpathname(lfname,file,iVar4,0);
  LVar6 = args[1];
  if (1 < LVar6 - 0xe0002) {
    if (1 < LVar6 - 0xe0000) {
      return 0;
    }
    LVar6 = args[2];
    iVar5 = 2;
    if ((LVar6 != 0xe0003) && (LVar6 != 0xe0002)) {
      bVar14 = false;
      iVar5 = 0;
      if (LVar6 != 0xe0001) goto LAB_00115d01;
      iVar5 = 0x202;
    }
    bVar14 = false;
    goto LAB_00115d01;
  }
  switch(args[2]) {
  case 0xe0000:
    iVar5 = 0;
    bVar14 = false;
    if (LVar6 == 0xe0002) {
      return 0;
    }
    break;
  case 0xe0001:
    unpack_filename(file,dir,name,ver,1);
    iVar4 = make_directory(dir);
    iVar5 = 0x242;
    goto LAB_00115cf0;
  case 0xe0002:
  case 0xe0003:
    unpack_filename(file,dir,name,ver,1);
    iVar4 = make_directory(dir);
    iVar5 = 0x42;
LAB_00115cf0:
    if (iVar4 == 0) {
      return 0;
    }
    break;
  default:
    bVar14 = false;
  }
LAB_00115d01:
  bVar3 = false;
  if (host._0_4_ == 0x4b5344) {
    iVar4 = unpack_filename(file,dir,name,ver,1);
    if (iVar4 == 0) {
      return 0;
    }
    iVar4 = true_name(dir);
    if (iVar4 != -1) {
      return 0;
    }
    iVar4 = get_version_array(dir,name);
    if (iVar4 == 0) {
      return 0;
    }
    strcpy(file,name);
    if (ver[0] != '\0') {
      sVar9 = strlen(file);
      (file + sVar9)[0] = '.';
      (file + sVar9)[1] = '~';
      file[sVar9 + 2] = '\0';
      strcat(file,ver);
      sVar9 = strlen(file);
      (file + sVar9)[0] = '~';
      (file + sVar9)[1] = '\0';
    }
    switch(args[1]) {
    case 0xe0000:
      iVar4 = get_old(dir,VA.files,file,name);
      break;
    case 0xe0001:
      iVar4 = get_oldest(dir,VA.files,file,name);
      break;
    case 0xe0002:
      iVar4 = get_new(dir,VA.files,file,name);
      break;
    case 0xe0003:
      iVar4 = get_old_new(dir,VA.files,file,name);
      break;
    default:
      return 0;
    }
    if (iVar4 == 0) {
      return 0;
    }
    alarm(TIMEOUT_TIME);
    piVar10 = __errno_location();
    do {
      *piVar10 = 0;
      iVar4 = stat(file,(stat *)&sbuf);
      if (iVar4 != -1) break;
    } while (*piVar10 == 4);
    alarm(0);
    if (iVar4 == 0) {
      if ((sbuf.st_mode & 0xf000) != 0x8000) {
        *Lisp_errno = 0x17;
        return 0;
      }
    }
    else if (!(bool)(bVar14 & *piVar10 == 2)) {
      *Lisp_errno = *piVar10;
      return 0;
    }
    if (!bVar14) {
      bVar3 = false;
      goto LAB_00115fe9;
    }
    alarm(TIMEOUT_TIME);
    do {
      *piVar10 = 0;
      iVar4 = access(file,0);
      if (iVar4 != -1) {
        alarm(0);
        bVar3 = true;
        goto LAB_00115fe9;
      }
    } while (*piVar10 == 4);
    alarm(0);
    if (*piVar10 != 2) {
      *Lisp_errno = *piVar10;
      return 0;
    }
    iVar4 = maintain_version(file,1);
    bVar3 = true;
    if (iVar4 != 0) goto LAB_00115fe9;
    uVar13 = (ulong)TIMEOUT_TIME;
    alarm(TIMEOUT_TIME);
    do {
      *piVar10 = 0;
      iVar4 = close((int)uVar13);
      if (iVar4 != -1) break;
    } while (*piVar10 == 4);
  }
  else {
LAB_00115fe9:
    alarm(TIMEOUT_TIME);
    piVar10 = __errno_location();
LAB_0011601b:
    *piVar10 = 0;
    iVar4 = open(file,iVar5,0x1b6);
    if (iVar4 == -1) goto code_r0x00116033;
    alarm(0);
    if ((bVar3) && (iVar5 = maintain_version(file,0), iVar5 == 0)) {
      alarm(TIMEOUT_TIME);
      goto LAB_0011615e;
    }
    alarm(TIMEOUT_TIME);
    do {
      *piVar10 = 0;
      iVar5 = fstat(iVar4,(stat *)&sbuf);
      if (iVar5 != -1) {
        alarm(0);
        pLVar7 = NativeAligned4FromLAddr(args[3]);
        *pLVar7 = (int)sbuf.st_mtim.tv_sec + 0x1c94b00;
        pLVar7 = NativeAligned4FromLAddr(args[4]);
        if ((host._0_4_ != 0x4b5344) && ((sbuf.st_mode & 0xf000) != 0x4000)) {
          sbuf.st_size._0_4_ = 0xffffffff;
        }
        *pLVar7 = (LispPTR)sbuf.st_size;
        LVar6 = GetSmallp((long)iVar4);
        return LVar6;
      }
    } while (*piVar10 == 4);
    alarm(0);
    alarm(TIMEOUT_TIME);
    while( true ) {
      *piVar10 = 0;
      iVar5 = close(iVar4);
      if (iVar5 != -1) break;
      if (*piVar10 != 4) break;
    }
  }
  alarm(0);
  iVar4 = *piVar10;
LAB_00116180:
  *Lisp_errno = iVar4;
  return 0;
code_r0x00116033:
  if (*piVar10 != 4) goto code_r0x00116038;
  goto LAB_0011601b;
code_r0x00116038:
  alarm(0);
  iVar4 = *piVar10;
  goto LAB_00116180;
  while (*piVar10 == 4) {
LAB_0011615e:
    *piVar10 = 0;
    iVar5 = close(iVar4);
    if (iVar5 != -1) break;
  }
  alarm(0);
  iVar4 = *piVar10;
  goto LAB_00116180;
}

Assistant:

LispPTR COM_openfile(LispPTR *args)
{
  char lfname[MAXPATHLEN + 5], file[MAXPATHLEN], host[MAXNAMLEN];
  char dir[MAXPATHLEN], name[MAXNAMLEN], ver[VERSIONLEN];
  int fatp, dskp, rval, fd, link_check_flg, flags, *bufp;
  size_t slen;
  struct stat sbuf;
#ifdef DOS
  char drive[1]; /* Drive designator */
  int extlen;    /* length of the raw file extension */
  char rawname[MAXNAMLEN];
#endif /* DOS */
  ERRSETJMP(NIL);
  Lisp_errno = (int *)NativeAligned4FromLAddr(args[5]);

  LispStringLength(args[0], slen, fatp);
  /*
   * Because of the version number convention, Lisp pathname might
   * be shorter than UNIX one.  For THIN string, the difference
   * is 2 bytes, for FAT string, 4 bytes.  Add 1 byte for NULL
   * terminating character.
   */
  slen = fatp ? slen + 4 + 1 : slen + 2 + 1;
  /* Add five for the host name field in Lisp format. */
  if (slen > MAXPATHLEN + 5) FileNameTooLong(NIL);

  LispStringToCString(args[0], lfname, MAXPATHLEN);

#ifdef DOS
  separate_host(lfname, host, drive);
#else
  separate_host(lfname, host);
#endif /* DOS */
  UPCASE(host);

  if (strcmp(host, "DSK") == 0)
    dskp = 1;
  else if (strcmp(host, "UNIX") == 0)
    dskp = 0;
  else
    return (NIL);

/*
 * Convert a Lisp file name to UNIX one.  If host is DSK, we also have to
 * convert a version field.
 */
#ifdef DOS
  unixpathname(lfname, file, dskp, 0, drive, &extlen, rawname);
#else
  unixpathname(lfname, file, dskp, 0);
#endif

  /*
   * Set up the flags argument for open system call.
   * And we have to handle the non existing directory case if the device is
   * DSK.
   * link_check_flg is used to determine whether we have to check a hard-link
   * based version control after opening a file.
   */
  link_check_flg = 0;
  switch (args[1]) {
    case RECOG_OLD:
    case RECOG_OLDEST:
      switch (args[2]) {
        case ACCESS_INPUT: flags = O_RDONLY; break;

        case ACCESS_OUTPUT:
          /*
           * The current implementation of Lisp page mapped device requires
           * that the output stream being "readable"!
           */
          flags = O_RDWR | O_TRUNC;
          break;

        case ACCESS_BOTH: flags = O_RDWR; break;

        case ACCESS_APPEND:
          /*
           * Should be O_WRONLY | O_APPEND.  But Lisp needs it.
           */
          flags = O_RDWR;
          break;
      }
      break;
    case RECOG_NEW:
    case RECOG_OLD_NEW:
      /*
       * In DSK device, the not existing yet file can be recognized.  In this
       * case, if there is a chance to create a new file, we have to make
       * sure that all directory to reach the recognized file exists.
       * Also we have to check the versionless file is correctly maintained
       * or not when we have a chance to create a new file.
       */
      switch (args[2]) {
        case ACCESS_INPUT:
          if (args[1] == RECOG_NEW) {
            /*
             * Opening a input stream to a new, not yet
             * existing, file does not make sense.
             */
            return (NIL);
          } else {
            /*
             * Even if OLD/NEW recognition, opening a input
             * stream never try to create a new file.  Thus,
             * without O_CREAT.
             */
            flags = O_RDONLY;
          }
          break;

        case ACCESS_OUTPUT:
          flags = O_RDWR | O_TRUNC | O_CREAT;
          unpack_filename(file, dir, name, ver, 1);
          if (make_directory(dir) == 0) return (NIL);
          if (dskp) link_check_flg = 1;
          break;

        case ACCESS_BOTH:
          flags = O_RDWR | O_CREAT;
          unpack_filename(file, dir, name, ver, 1);
          if (make_directory(dir) == 0) return (NIL);
          if (dskp) link_check_flg = 1;
          break;

        case ACCESS_APPEND:
          flags = O_RDWR | O_CREAT;
          unpack_filename(file, dir, name, ver, 1);
          if (make_directory(dir) == 0) return (NIL);
          if (dskp) link_check_flg = 1;
          break;
      }
      break;

    default: return (NIL);
  }

  /*
   * The file name which has been passed from Lisp is sometimes different
   * from the actual file name on DSK, even after the Lisp name is converted
   * to UNIX form with unixpathname.  Lisp always recognize a file on DSK
   * with version.  If the versionless file exists and it is not correctly
   * maintained, that is it is not hard linked to the existing highest
   * versioned file, Lisp regards such link missing versionless file as
   * the highest versioned file, but the actual name on the file system
   * is still versionless.
   * get_old, get_oldest, get_new, get_old_new routines handle all of the
   * complicated cases correctly and let us know the "Lisp recognizing"
   * name and "Real" name.  Both of them are UNIX format.
   * At this point, we will use one of the four routines and get the
   * real name.  We can use it to open a file which is requested from Lisp
   * with the "Lisp recognizing" name.
   */

  if (dskp) {
    if (unpack_filename(file, dir, name, ver, 1) == 0) return (NIL);
    if (true_name(dir) != -1) return (0);
    if (get_version_array(dir, name) == 0) return (NIL);
    ConcNameAndVersion(name, ver, file);

    switch (args[1]) {
      case RECOG_OLD:
        if (get_old(dir, VA.files, file, name) == 0) return (NIL);
        break;

      case RECOG_OLDEST:
        if (get_oldest(dir, VA.files, file, name) == 0) return (NIL);
        break;

      case RECOG_NEW:
        if (get_new(dir, VA.files, file, name) == 0) return (NIL);
        break;

      case RECOG_OLD_NEW:
        if (get_old_new(dir, VA.files, file, name) == 0) return (NIL);
        break;

      default: return (NIL);
    }
  }

  /*
   * DSK device only allow to open a regular file.
   */
  if (dskp) {
    TIMEOUT(rval = stat(file, &sbuf));
    if (rval == 0) {
      if (!S_ISREG(sbuf.st_mode)) {
        /*
         * The Lisp code handles this case as same as "file table
         * overflow" error.  Final error message is "File won't
         * open".
         */
        *Lisp_errno = ENFILE;
        return (NIL);
      }
    } else {
      /*
       * When stat failed, only if the reason is "file does not
       * exist" and we are trying to open a file with a mode we can
       * create a new file, we can proceed.
       */
      if (errno != ENOENT || !link_check_flg) {
        *Lisp_errno = errno;
        return (NIL);
      }
    }
  }
  if (dskp && link_check_flg) {
    /*
     * When we are opening a file with a mode we might create a new file,
     * we have to make sure that versionless file is maintained
     * correctly before we actually creating a new file, because a
     * created new file will change the status and the recognition on
     * the same file with the same recognition mode will return the
     * different result.
     * At this point, the third argument for maintain_version, forcep is
     * 1, because a lonly versionless file should be linked to version 1.
     * If we are opening a file recognized with new mode, version 2,
     * without pre-linking a versionless to version 1, the final
     * clean up maintain_version will link the versionless to version 3.
     */
    TIMEOUT(rval = access(file, F_OK));
    if (rval == -1) {
      if (errno == ENOENT) {
        /*
         * Actually we are creating a new file.  We have to
         * maintain a version status.
         */
        if (maintain_version(file, 1) == 0) {
          TIMEOUT(rval = close(fd));
          *Lisp_errno = errno;
          return (NIL);
        }
      } else {
        /*
         * Because of other reason, access call failed.
         */
        *Lisp_errno = errno;
        return (NIL);
      }
    } else {
/*
 * The subjective file has already existed.  We don't need
 * to maintain a version.
 */
#ifdef DOS
      if (args[1] == RECOG_NEW) {
        char old[MAXPATHLEN];
        make_old_version(old, file);
        unlink(old);
        rename(file, old); /* make old version */
      }
#endif /* DOS */
    }
  }

  /*
   * If a new file is created, its actual mode is computed from the
   * third argument for open and the process's umask.  I'm pretty sure
   * 0666 would be most appropriate mode to specify here.
   */
  TIMEOUT(fd = open(file, flags, 0666));
  if (fd == -1) {
    *Lisp_errno = errno;
    return (NIL);
  }

  if (dskp && link_check_flg) {
    /*
     * Again we have to maintain version to clean up the directory.
     * This time we invoke maintain_version with forcep off, because
     * the entirely newly created file, versionless file, should not
     * be linked to any file.
     */
    if (maintain_version(file, 0) == 0) {
      TIMEOUT(close(fd));
      *Lisp_errno = errno;
      return (NIL);
    }
  }

  TIMEOUT(rval = fstat(fd, &sbuf));
  if (rval == -1) {
    TIMEOUT(close(fd));
    *Lisp_errno = errno;
    return (NIL);
  }

  bufp = (int *)NativeAligned4FromLAddr(args[3]);
  *bufp = ToLispTime(sbuf.st_mtime);

  bufp = (int *)NativeAligned4FromLAddr(args[4]);
  if (!dskp && (!S_ISREG(sbuf.st_mode)) && (!S_ISDIR(sbuf.st_mode))) {
    /*
     * Not a regular file or directory file.  Put on a marker.
     */
    *bufp = SPECIALFILEMARK;
  } else {
    *bufp = sbuf.st_size;
  }

  return (GetSmallp(fd));
}